

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UChar * __thiscall
icu_63::Normalizer2Impl::findNextCompBoundary
          (Normalizer2Impl *this,UChar *p,UChar *limit,UBool onlyContiguous)

{
  UChar UVar1;
  ushort uVar2;
  UCPTrie *trie;
  int iVar3;
  UChar *unaff_RBX;
  uint c;
  UChar *pUVar4;
  UChar *codePointStart;
  bool bVar5;
  
  do {
    if (p == limit) {
      return p;
    }
    pUVar4 = p + 1;
    UVar1 = *p;
    c = (uint)(ushort)UVar1;
    if ((c & 0xf800) == 0xd800) {
      if ((pUVar4 == limit || ((byte)((ushort)UVar1 >> 10) & 1) != 0) ||
         (UVar1 = *pUVar4, ((ushort)UVar1 & 0xfc00) != 0xdc00)) {
        iVar3 = this->normTrie->dataLength + -1;
      }
      else {
        pUVar4 = p + 2;
        c = c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
        trie = this->normTrie;
        if ((int)c < trie->highStart) {
          iVar3 = ucptrie_internalSmallIndex_63(trie,c);
        }
        else {
          iVar3 = trie->dataLength + -2;
        }
      }
    }
    else {
      iVar3 = (c & 0x3f) + (uint)this->normTrie->index[(ushort)UVar1 >> 6];
    }
    bVar5 = false;
    if (((int)(uint)(ushort)this->minCompNoMaybeCP <= (int)c) &&
       (uVar2 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar3 * 2),
       this->minNoNoCompNoMaybeCC <= uVar2)) {
      if ((uVar2 < this->limitNoNo) || (this->minMaybeYes <= uVar2)) {
        bVar5 = (uVar2 & 1) == 0;
        if (onlyContiguous != '\0' && !bVar5) {
          bVar5 = true;
          if (uVar2 != 1) {
            if (uVar2 < this->limitNoNo) {
              bVar5 = *(ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffffffe)) < 0x200;
            }
            else {
              bVar5 = (uVar2 & 6) < 3;
            }
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        p = unaff_RBX;
        if (!bVar5) {
          p = pUVar4;
        }
      }
      else {
        bVar5 = false;
      }
    }
    unaff_RBX = p;
    p = pUVar4;
  } while (bVar5);
  return unaff_RBX;
}

Assistant:

const UChar *Normalizer2Impl::findNextCompBoundary(const UChar *p, const UChar *limit,
                                                   UBool onlyContiguous) const {
    while (p != limit) {
        const UChar *codePointStart = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        if (hasCompBoundaryBefore(c, norm16)) {
            return codePointStart;
        }
        if (norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return p;
        }
    }
    return p;
}